

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

void __thiscall absl::lts_20250127::Cord::Prepend(Cord *this,Cord *src)

{
  byte bVar1;
  Nonnull<CordRep_*> pCVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  size_t sVar6;
  CordRep *pCVar7;
  string_view src_00;
  
  pCVar7 = (this->contents_).data_.rep_.field_0.as_tree.rep;
  if ((pCVar7 != (CordRep *)0x0 && ((this->contents_).data_.rep_.field_0.data[0] & 1U) != 0) &&
     (pCVar7->length == 0)) {
    Prepend();
  }
  bVar1 = (src->contents_).data_.rep_.field_0.data[0];
  uVar5 = (ulong)(char)bVar1;
  if ((uVar5 & 1) == 0) {
    uVar3 = uVar5 >> 1;
  }
  else {
    uVar3 = ((src->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (uVar3 != 0) {
    pCVar7 = (src->contents_).data_.rep_.field_0.as_tree.rep;
    if (pCVar7 == (CordRep *)0x0 || (bVar1 & 1) == 0) {
      pcVar4 = (char *)0x0;
      if ((uVar5 & 1) == 0) {
        sVar6 = uVar5 >> 1;
        pcVar4 = (char *)((long)&(src->contents_).data_.rep_.field_0 + 1);
      }
      else {
        sVar6 = pCVar7->length;
      }
      src_00._M_str = pcVar4;
      src_00._M_len = sVar6;
      PrependArray(this,src_00,kPrependString);
      return;
    }
    LOCK();
    (pCVar7->refcount).count_.super___atomic_base<int>._M_i =
         (pCVar7->refcount).count_.super___atomic_base<int>._M_i + 2;
    UNLOCK();
    if (pCVar7->tag == '\x02') {
      pCVar2 = (Nonnull<CordRep_*>)pCVar7[1].length;
      if ((pCVar7->refcount).count_.super___atomic_base<int>._M_i == 2) {
        if (pCVar7->tag != '\x02') {
          __assert_fail("IsCrc()",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_crc.h"
                        ,0x5a,"CordRepCrc *absl::cord_internal::CordRep::crc()");
        }
        crc_internal::CrcCordState::~CrcCordState((CrcCordState *)&pCVar7[1].refcount);
        operator_delete(pCVar7,0x20);
        pCVar7 = pCVar2;
      }
      else {
        if (pCVar2 == (Nonnull<CordRep_*>)0x0) {
          __assert_fail("rep != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x391,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
        }
        LOCK();
        (pCVar2->refcount).count_.super___atomic_base<int>._M_i =
             (pCVar2->refcount).count_.super___atomic_base<int>._M_i + 2;
        UNLOCK();
        cord_internal::CordRep::Unref(pCVar7);
        pCVar7 = pCVar2;
      }
    }
    InlineRep::PrependTree(&this->contents_,pCVar7,kPrependCord);
    return;
  }
  return;
}

Assistant:

void Cord::Prepend(const Cord& src) {
  contents_.MaybeRemoveEmptyCrcNode();
  if (src.empty()) return;

  CordRep* src_tree = src.contents_.tree();
  if (src_tree != nullptr) {
    CordRep::Ref(src_tree);
    contents_.PrependTree(cord_internal::RemoveCrcNode(src_tree),
                          CordzUpdateTracker::kPrependCord);
    return;
  }

  // `src` cord is inlined.
  absl::string_view src_contents(src.contents_.data(), src.contents_.size());
  return Prepend(src_contents);
}